

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

int __thiscall
OSSLRSA::verify(OSSLRSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong extraout_RAX;
  RSA *pRVar5;
  size_t sVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  long lVar9;
  undefined8 uVar10;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ByteString *this_00;
  ulong extraout_RAX_05;
  long in_stack_00000008;
  int retLen_2;
  RSA *rsa_2;
  ByteString recoveredData_2;
  OSSLRSAPublicKey *osslKey_2;
  int status;
  size_t sParamLen;
  EVP_MD *hash;
  size_t allowedLen;
  int retLen_1;
  RSA *rsa_1;
  ByteString recoveredData_1;
  OSSLRSAPublicKey *osslKey_1;
  RSA_PKCS_PSS_PARAMS *pssParam;
  int retLen;
  RSA *rsa;
  ByteString recoveredData;
  OSSLRSAPublicKey *osslKey;
  ByteString *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  ByteString *in_stack_fffffffffffffd98;
  EVP_MD *local_e0;
  size_t local_d8;
  bool local_1;
  
  iVar1 = (int)tbs;
  if (iVar1 == 3) {
    uVar4 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPublicKey::type);
    if ((uVar4 & 1) == 0) {
      softHSMLog(3,"verify",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x2b1,"Invalid key type supplied");
      local_1 = false;
      uVar4 = extraout_RAX;
    }
    else {
      ByteString::ByteString((ByteString *)0x1bf259);
      (**(code **)(*(long *)ctx + 0x40))();
      ByteString::size((ByteString *)0x1bf281);
      ByteString::resize((ByteString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                         ,(size_t)in_stack_fffffffffffffd78);
      pRVar5 = (RSA *)OSSLRSAPublicKey::getOSSLKey
                                ((OSSLRSAPublicKey *)
                                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      sVar6 = ByteString::size((ByteString *)0x1bf2d6);
      puVar7 = ByteString::const_byte_str(in_stack_fffffffffffffd78);
      puVar8 = ByteString::operator[]
                         ((ByteString *)
                          CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                          (size_t)in_stack_fffffffffffffd78);
      iVar1 = RSA_public_decrypt((int)sVar6,puVar7,puVar8,pRVar5,1);
      if (iVar1 == -1) {
        softHSMLog(3,"verify",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x2c3,"Public key operation failed");
        local_1 = false;
      }
      else {
        ByteString::resize((ByteString *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                           (size_t)in_stack_fffffffffffffd78);
        local_1 = ByteString::operator==
                            (in_stack_fffffffffffffd98,
                             (ByteString *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      }
      ByteString::~ByteString((ByteString *)0x1bf42c);
      uVar4 = extraout_RAX_00;
    }
    goto LAB_001bfc11;
  }
  if (iVar1 != 10) {
    if (iVar1 == 1) {
      uVar4 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPublicKey::type);
      if ((uVar4 & 1) == 0) {
        softHSMLog(3,"verify",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x329,"Invalid key type supplied");
        local_1 = false;
        uVar4 = extraout_RAX_04;
      }
      else {
        ByteString::ByteString((ByteString *)0x1bfa28);
        (**(code **)(*(long *)ctx + 0x40))();
        ByteString::size((ByteString *)0x1bfa4a);
        ByteString::resize((ByteString *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                           (size_t)in_stack_fffffffffffffd78);
        pRVar5 = (RSA *)OSSLRSAPublicKey::getOSSLKey
                                  ((OSSLRSAPublicKey *)
                                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        sVar6 = ByteString::size((ByteString *)0x1bfa93);
        iVar1 = (int)sVar6;
        this_00 = (ByteString *)ByteString::const_byte_str(in_stack_fffffffffffffd78);
        puVar7 = ByteString::operator[]
                           ((ByteString *)
                            CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                            (size_t)in_stack_fffffffffffffd78);
        iVar2 = RSA_public_decrypt(iVar1,(uchar *)this_00,puVar7,pRVar5,3);
        if (iVar2 == -1) {
          softHSMLog(3,"verify",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x33b,"Public key operation failed");
          local_1 = false;
        }
        else {
          ByteString::resize((ByteString *)CONCAT44(iVar2,in_stack_fffffffffffffd80),
                             (size_t)in_stack_fffffffffffffd78);
          local_1 = ByteString::operator==
                              (this_00,(ByteString *)CONCAT44(iVar1,in_stack_fffffffffffffd90));
        }
        ByteString::~ByteString((ByteString *)0x1bfbc5);
        uVar4 = extraout_RAX_05;
      }
    }
    else {
      uVar3 = AsymmetricAlgorithm::verify
                        (&this->super_AsymmetricAlgorithm,ctx,sig,siglen,
                         (uchar *)((ulong)tbs & 0xffffffff),tbslen);
      uVar4 = (ulong)uVar3 & 0xffffffffffffff01;
      local_1 = SUB81(uVar4,0);
    }
    goto LAB_001bfc11;
  }
  if ((tbslen == 0) || (in_stack_00000008 != 0x10)) {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x2d2,"Invalid parameters supplied");
    local_1 = false;
    uVar4 = extraout_RAX_01;
    goto LAB_001bfc11;
  }
  uVar4 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLRSAPublicKey::type);
  if ((uVar4 & 1) == 0) {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x2da,"Invalid key type supplied");
    local_1 = false;
    uVar4 = extraout_RAX_02;
    goto LAB_001bfc11;
  }
  ByteString::ByteString((ByteString *)0x1bf504);
  (**(code **)(*(long *)ctx + 0x40))();
  ByteString::size((ByteString *)0x1bf52c);
  ByteString::resize((ByteString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (size_t)in_stack_fffffffffffffd78);
  pRVar5 = (RSA *)OSSLRSAPublicKey::getOSSLKey
                            ((OSSLRSAPublicKey *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  sVar6 = ByteString::size((ByteString *)0x1bf581);
  puVar7 = ByteString::const_byte_str(in_stack_fffffffffffffd78);
  puVar8 = ByteString::operator[]
                     ((ByteString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (size_t)in_stack_fffffffffffffd78);
  iVar1 = RSA_public_decrypt((int)sVar6,puVar7,puVar8,pRVar5,3);
  if (iVar1 == -1) {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x2ec,"Public key operation failed");
    local_1 = false;
  }
  else {
    ByteString::resize((ByteString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (size_t)in_stack_fffffffffffffd78);
    switch(*(undefined4 *)tbslen) {
    case 2:
      local_e0 = EVP_sha1();
      local_d8 = 0x14;
      break;
    case 3:
      local_e0 = EVP_sha224();
      local_d8 = 0x1c;
      break;
    case 4:
      local_e0 = EVP_sha256();
      local_d8 = 0x20;
      break;
    case 5:
      local_e0 = EVP_sha384();
      local_d8 = 0x30;
      break;
    case 6:
      local_e0 = EVP_sha512();
      local_d8 = 0x40;
      break;
    default:
      local_1 = false;
      goto LAB_001bf99c;
    }
    sVar6 = ByteString::size((ByteString *)0x1bf7e4);
    if (sVar6 == local_d8) {
      uVar4 = *(ulong *)(tbslen + 8);
      lVar9 = (**(code **)(*(long *)ctx + 0x20))();
      if (((lVar9 + 6U >> 3) - 2) - local_d8 < uVar4) {
        uVar10 = (**(code **)(*(long *)ctx + 0x20))();
        softHSMLog(3,"verify",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x318,"sLen (%lu) is too large for current key size (%lu)",uVar4,uVar10);
        local_1 = false;
      }
      else {
        puVar7 = ByteString::const_byte_str(in_stack_fffffffffffffd78);
        puVar8 = ByteString::const_byte_str(in_stack_fffffffffffffd78);
        iVar1 = RSA_verify_PKCS1_PSS_mgf1
                          (pRVar5,puVar7,local_e0,local_e0,puVar8,*(int *)(tbslen + 8));
        local_1 = iVar1 == 1;
      }
    }
    else {
      local_1 = false;
    }
  }
LAB_001bf99c:
  ByteString::~ByteString((ByteString *)0x1bf9a9);
  uVar4 = extraout_RAX_03;
LAB_001bfc11:
  return (int)CONCAT71((int7)(uVar4 >> 8),local_1);
}

Assistant:

bool OSSLRSA::verify(PublicKey* publicKey, const ByteString& originalData,
		     const ByteString& signature, const AsymMech::Type mechanism,
		     const void* param /* = NULL */, const size_t paramLen /* = 0 */)
{
	if (mechanism == AsymMech::RSA_PKCS)
	{
		// Specific implementation for PKCS #1 only verification; originalData is assumed to contain
		// a digestInfo structure and verification is performed by comparing originalData to the data
		// recovered from the signature

		// Check if the public key is the right type
		if (!publicKey->isOfType(OSSLRSAPublicKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// Perform the RSA public key operation
		OSSLRSAPublicKey* osslKey = (OSSLRSAPublicKey*) publicKey;

		ByteString recoveredData;

		recoveredData.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		int retLen = RSA_public_decrypt(signature.size(), (unsigned char*) signature.const_byte_str(), &recoveredData[0], rsa, RSA_PKCS1_PADDING);

		if (retLen == -1)
		{
			ERROR_MSG("Public key operation failed");

			return false;
		}

		recoveredData.resize(retLen);

		return (originalData == recoveredData);
	}
	else if (mechanism == AsymMech::RSA_PKCS_PSS)
	{
		const RSA_PKCS_PSS_PARAMS *pssParam = (RSA_PKCS_PSS_PARAMS*)param;

		if (pssParam == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS))
		{
			ERROR_MSG("Invalid parameters supplied");

			return false;
		}

		// Check if the public key is the right type
		if (!publicKey->isOfType(OSSLRSAPublicKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// Perform the RSA public key operation
		OSSLRSAPublicKey* osslKey = (OSSLRSAPublicKey*) publicKey;

		ByteString recoveredData;

		recoveredData.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		int retLen = RSA_public_decrypt(signature.size(), (unsigned char*) signature.const_byte_str(), &recoveredData[0], rsa, RSA_NO_PADDING);

		if (retLen == -1)
		{
			ERROR_MSG("Public key operation failed");

			return false;
		}

		recoveredData.resize(retLen);

		size_t allowedLen;
		const EVP_MD* hash = NULL;

		switch (pssParam->hashAlg)
		{
		case HashAlgo::SHA1:
			hash = EVP_sha1();
			allowedLen = 20;
			break;
		case HashAlgo::SHA224:
			hash = EVP_sha224();
			allowedLen = 28;
			break;
		case HashAlgo::SHA256:
			hash = EVP_sha256();
			allowedLen = 32;
			break;
		case HashAlgo::SHA384:
			hash = EVP_sha384();
			allowedLen = 48;
			break;
		case HashAlgo::SHA512:
			hash = EVP_sha512();
			allowedLen = 64;
			break;
		default:
			return false;
		}

		if (originalData.size() != allowedLen) {
			return false;
		}

		size_t sParamLen = pssParam->sLen;
		if (sParamLen > ((osslKey->getBitLength()+6)/8-2-allowedLen))
		{
			ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
				  (unsigned long)sParamLen, osslKey->getBitLength());
			return false;
		}

		int status = RSA_verify_PKCS1_PSS_mgf1(rsa, (unsigned char*)originalData.const_byte_str(), hash, hash, (unsigned char*) recoveredData.const_byte_str(), pssParam->sLen);

		return (status == 1);
	}
	else if (mechanism == AsymMech::RSA)
	{
		// Specific implementation for raw RSA verifiction; originalData is assumed to contain the
		// full input data used to compute the signature and verification is performed by comparing
		// originalData to the data recovered from the signature

		// Check if the public key is the right type
		if (!publicKey->isOfType(OSSLRSAPublicKey::type))
		{
			ERROR_MSG("Invalid key type supplied");

			return false;
		}

		// Perform the RSA public key operation
		OSSLRSAPublicKey* osslKey = (OSSLRSAPublicKey*) publicKey;

		ByteString recoveredData;

		recoveredData.resize(osslKey->getN().size());

		RSA* rsa = osslKey->getOSSLKey();

		int retLen = RSA_public_decrypt(signature.size(), (unsigned char*) signature.const_byte_str(), &recoveredData[0], rsa, RSA_NO_PADDING);

		if (retLen == -1)
		{
			ERROR_MSG("Public key operation failed");

			return false;
		}

		recoveredData.resize(retLen);

		return (originalData == recoveredData);
	}
	else
	{
		// Call the generic function
		return AsymmetricAlgorithm::verify(publicKey, originalData, signature, mechanism, param, paramLen);
	}
}